

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::HDivPermutation
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,int side,
          TPZVec<int> *permutegather)

{
  int iVar1;
  int iVar2;
  MElementType MVar3;
  ostream *this_00;
  TPZGeoNode *this_01;
  _func_int **pp_Var4;
  ulong uVar5;
  int *piVar6;
  TPZVec<int> *in_RDX;
  int in_ESI;
  long *in_RDI;
  int transformid;
  MElementType sidetype;
  int64_t nodeindex;
  int inode;
  TPZManVector<long,_4> id;
  int64_t nsidenodes;
  stringstream sout;
  size_t in_stack_000001a8;
  char *in_stack_000001b0;
  int sidedimension;
  int dimension;
  TPZVec<int> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd9c;
  TPZGeoEl *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  TPZManVector<long,_4> *in_stack_fffffffffffffdb0;
  TPZVec<long> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdf8;
  TPZVec<long> local_200 [2];
  long local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  int local_20;
  int local_1c;
  TPZVec<int> *local_18;
  int local_c;
  
  local_1c = 2;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_20 = pztopology::TPZTriangle::SideDimension(0x17d4702);
  if (local_1c != local_20 + 1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    this_00 = std::operator<<(local_198,"HDivPermutation called with wrong side parameter ");
    std::ostream::operator<<(this_00,local_c);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  iVar1 = pztopology::TPZTriangle::NSideNodes(local_c);
  local_1c0 = (long)iVar1;
  TPZManVector<long,_4>::TPZManVector
            (in_stack_fffffffffffffdb0,CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
            );
  for (iVar1 = 0; iVar1 < local_1c0; iVar1 = iVar1 + 1) {
    (**(code **)(*in_RDI + 0x2d0))(in_RDI,local_c,iVar1);
    this_01 = TPZGeoEl::NodePtr(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    iVar2 = TPZGeoNode::Id(this_01);
    pp_Var4 = (_func_int **)(long)iVar2;
    in_stack_fffffffffffffdb8 = (TPZVec<long> *)TPZVec<long>::operator[](local_200,(long)iVar1);
    in_stack_fffffffffffffdb8->_vptr_TPZVec = pp_Var4;
  }
  MVar3 = pztopology::TPZTriangle::Type(local_c);
  uVar5 = (ulong)MVar3;
  switch(uVar5) {
  case 0:
    piVar6 = TPZVec<int>::operator[](local_18,0);
    *piVar6 = 0;
    break;
  case 1:
    pztopology::TPZLine::GetTransformId
              ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    pztopology::TPZLine::GetSideHDivPermutation(in_stack_fffffffffffffd94,in_stack_fffffffffffffd88)
    ;
    break;
  case 2:
    in_stack_fffffffffffffd94 = pztopology::TPZTriangle::GetTransformId(in_stack_fffffffffffffdb8);
    pztopology::TPZTriangle::GetSideHDivPermutation
              (in_stack_fffffffffffffd94,in_stack_fffffffffffffd88);
    break;
  case 3:
    iVar1 = pztopology::TPZQuadrilateral::GetTransformId
                      ((TPZVec<long> *)CONCAT44(iVar1,in_stack_fffffffffffffdf8));
    pztopology::TPZQuadrilateral::GetSideHDivPermutation
              ((int)(uVar5 >> 0x20),(TPZVec<int> *)CONCAT44(in_stack_fffffffffffffd9c,iVar1));
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_000001b0,in_stack_000001a8);
  }
  TPZManVector<long,_4>::~TPZManVector
            ((TPZManVector<long,_4> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
  ;
  return;
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::HDivPermutation(int side, TPZVec<int> &permutegather)
{
	int dimension = TGeo::Dimension;
	int sidedimension = TGeo::SideDimension(side);

	if(dimension != sidedimension+1)
	{
		std::stringstream sout;
		sout << "HDivPermutation called with wrong side parameter " << side;
#ifdef PZ_LOG
        TPZLogger loggerrefless ("pz.mesh.tpzgeoelrefless");
		LOGPZ_ERROR(loggerrefless,sout.str())
#endif
	}
    
    // Douglas -- teste em 2014 09 04
    // conta o numero de lados da face
    const int64_t nsidenodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t,4> id(nsidenodes);  // 
    
	for(int inode=0; inode<nsidenodes; inode++)
    {
        // esta parte pega os indices locais dos nos apenas da face em questao
        int64_t nodeindex = SideNodeLocId(side, inode);
        // com base nestes indices locais, pegamos os indices globais para determinar a permutacao
        id[inode] = NodePtr(nodeindex)->Id();
    }
    
    // Esse bloco parece pegar todos os vertices do cubo para fazer a permutacao, deveria ser da face
//    TPZManVector<int64_t,TGeo::NCornerNodes> id(TGeo::NCornerNodes);
//	for(int i=0; i<TGeo::NCornerNodes; i++)
//    {
//        int64_t nodeindex = fGeo.fNodeIndexes[i];
//        id[i] = Mesh()->NodeVec()[nodeindex].Id();
//    }
    
    MElementType sidetype = TGeo::Type(side);
    int transformid;
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EPoint:
            transformid = 0;
            permutegather[0] = 0;
            break;
        default:
            DebugStop();
            break;
    }
#ifdef PZ_LOG
    TPZLogger loggerrefless ("pz.mesh.tpzgeoelrefless");
    if (loggerrefless.isDebugEnabled()) {
        std::stringstream sout;
        sout << "side = " << side << " transform id " << transformid << " permutegather " << permutegather;
        LOGPZ_DEBUG(loggerrefless, sout.str())
    }
#endif
}